

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlUnloadRenderBatch(RenderBatch batch)

{
  int i;
  long lVar1;
  long lVar2;
  
  if (RLGL.ExtSupported.vao) {
    (*glad_glBindVertexArray)(0);
  }
  lVar2 = 0;
  (*glad_glDisableVertexAttribArray)(0);
  (*glad_glDisableVertexAttribArray)(1);
  (*glad_glDisableVertexAttribArray)(2);
  (*glad_glDisableVertexAttribArray)(3);
  (*glad_glBindBuffer)(0x8892,0);
  (*glad_glBindBuffer)(0x8893,0);
  for (lVar1 = 0; lVar1 < batch.buffersCount; lVar1 = lVar1 + 1) {
    (*glad_glDeleteBuffers)(1,(GLuint *)((long)(batch.vertexBuffer)->vboId + lVar2));
    (*glad_glDeleteBuffers)(1,(GLuint *)((long)(batch.vertexBuffer)->vboId + lVar2 + 4));
    (*glad_glDeleteBuffers)(1,(GLuint *)((long)(batch.vertexBuffer)->vboId + lVar2 + 8));
    (*glad_glDeleteBuffers)(1,(GLuint *)((long)(batch.vertexBuffer)->vboId + lVar2 + 0xc));
    if (RLGL.ExtSupported.vao == true) {
      (*glad_glDeleteVertexArrays)(1,(GLuint *)((long)(batch.vertexBuffer)->vboId + lVar2 + -4));
    }
    free(*(void **)((long)(batch.vertexBuffer)->vboId + lVar2 + -0x24));
    free(*(void **)((long)(batch.vertexBuffer)->vboId + lVar2 + -0x1c));
    free(*(void **)((long)(batch.vertexBuffer)->vboId + lVar2 + -0x14));
    free(*(void **)((long)(batch.vertexBuffer)->vboId + lVar2 + -0xc));
    lVar2 = lVar2 + 0x48;
  }
  free(batch.vertexBuffer);
  free(batch.draws);
  return;
}

Assistant:

void rlUnloadRenderBatch(RenderBatch batch)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    // Unbind everything
    if (RLGL.ExtSupported.vao) glBindVertexArray(0);
    glDisableVertexAttribArray(0);
    glDisableVertexAttribArray(1);
    glDisableVertexAttribArray(2);
    glDisableVertexAttribArray(3);
    glBindBuffer(GL_ARRAY_BUFFER, 0);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

    // Unload all vertex buffers data
    for (int i = 0; i < batch.buffersCount; i++)
    {
        // Delete VBOs from GPU (VRAM)
        glDeleteBuffers(1, &batch.vertexBuffer[i].vboId[0]);
        glDeleteBuffers(1, &batch.vertexBuffer[i].vboId[1]);
        glDeleteBuffers(1, &batch.vertexBuffer[i].vboId[2]);
        glDeleteBuffers(1, &batch.vertexBuffer[i].vboId[3]);

        // Delete VAOs from GPU (VRAM)
        if (RLGL.ExtSupported.vao) glDeleteVertexArrays(1, &batch.vertexBuffer[i].vaoId);

        // Free vertex arrays memory from CPU (RAM)
        RL_FREE(batch.vertexBuffer[i].vertices);
        RL_FREE(batch.vertexBuffer[i].texcoords);
        RL_FREE(batch.vertexBuffer[i].colors);
        RL_FREE(batch.vertexBuffer[i].indices);
    }

    // Unload arrays
    RL_FREE(batch.vertexBuffer);
    RL_FREE(batch.draws);
#endif
}